

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PNGImageHandler.cpp
# Opt level: O0

PDFFormXObject *
CreateImageFormXObjectFromImageXObject
          (PDFImageXObjectList *inImageXObject,ObjectIDType inFormXObjectID,
          png_uint_32 transformed_width,png_uint_32 transformed_height,
          DocumentContext *inDocumentContext)

{
  const_iterator this;
  PDFFormXObject *pPVar1;
  bool bVar2;
  EStatusCode EVar3;
  Trace *pTVar4;
  ResourcesDictionary *this_00;
  reference ppPVar5;
  undefined1 local_98 [4];
  EStatusCode status;
  _Self local_78;
  _Self local_70;
  const_iterator it;
  XObjectContentContext *xobjectContentContext;
  PDFRectangle local_50;
  PDFFormXObject *local_30;
  PDFFormXObject *formXObject;
  DocumentContext *inDocumentContext_local;
  png_uint_32 transformed_height_local;
  png_uint_32 transformed_width_local;
  ObjectIDType inFormXObjectID_local;
  PDFImageXObjectList *inImageXObject_local;
  
  local_30 = (PDFFormXObject *)0x0;
  formXObject = (PDFFormXObject *)inDocumentContext;
  inDocumentContext_local._0_4_ = transformed_height;
  inDocumentContext_local._4_4_ = transformed_width;
  _transformed_height_local = inFormXObjectID;
  inFormXObjectID_local = (ObjectIDType)inImageXObject;
  PDFRectangle::PDFRectangle(&local_50,0.0,0.0,(double)transformed_width,(double)transformed_height)
  ;
  local_30 = PDFHummus::DocumentContext::StartFormXObject
                       (inDocumentContext,&local_50,_transformed_height_local,(double *)0x0,false);
  PDFRectangle::~PDFRectangle(&local_50);
  if (local_30 == (PDFFormXObject *)0x0) {
    pTVar4 = Trace::DefaultTrace();
    Trace::TraceToLog(pTVar4,
                      "PNGImageHandler::CreateImageFormXObjectFromImageXObject. Unexpected Error, could not start form XObject for image"
                     );
  }
  else {
    it._M_node = (_List_node_base *)PDFFormXObject::GetContentContext(local_30);
    local_70._M_node =
         (_List_node_base *)
         std::__cxx11::list<PDFImageXObject_*,_std::allocator<PDFImageXObject_*>_>::begin
                   ((list<PDFImageXObject_*,_std::allocator<PDFImageXObject_*>_> *)
                    inFormXObjectID_local);
    while( true ) {
      local_78._M_node =
           (_List_node_base *)
           std::__cxx11::list<PDFImageXObject_*,_std::allocator<PDFImageXObject_*>_>::end
                     ((list<PDFImageXObject_*,_std::allocator<PDFImageXObject_*>_> *)
                      inFormXObjectID_local);
      bVar2 = std::operator!=(&local_70,&local_78);
      if (!bVar2) break;
      AbstractContentContext::q((AbstractContentContext *)it._M_node);
      AbstractContentContext::cm
                ((AbstractContentContext *)it._M_node,(double)inDocumentContext_local._4_4_,0.0,0.0,
                 (double)(png_uint_32)inDocumentContext_local,0.0,0.0);
      this = it;
      this_00 = PDFFormXObject::GetResourcesDictionary(local_30);
      ppPVar5 = std::_List_const_iterator<PDFImageXObject_*>::operator*(&local_70);
      ResourcesDictionary::AddImageXObjectMapping_abi_cxx11_((string *)local_98,this_00,*ppPVar5);
      AbstractContentContext::Do((AbstractContentContext *)this._M_node,(string *)local_98);
      std::__cxx11::string::~string((string *)local_98);
      AbstractContentContext::Q((AbstractContentContext *)it._M_node);
      std::_List_const_iterator<PDFImageXObject_*>::operator++(&local_70);
    }
    EVar3 = PDFHummus::DocumentContext::EndFormXObjectNoRelease
                      ((DocumentContext *)formXObject,local_30);
    if (EVar3 != eSuccess) {
      pTVar4 = Trace::DefaultTrace();
      Trace::TraceToLog(pTVar4,
                        "PNGImageHandler::CreateImageFormXObjectFromImageXObject. Unexpected Error, could not create form XObject for image"
                       );
      pPVar1 = local_30;
      if (local_30 != (PDFFormXObject *)0x0) {
        PDFFormXObject::~PDFFormXObject(local_30);
        operator_delete(pPVar1,0x1f0);
      }
      local_30 = (PDFFormXObject *)0x0;
    }
  }
  return local_30;
}

Assistant:

PDFFormXObject* CreateImageFormXObjectFromImageXObject(
	const PDFImageXObjectList& inImageXObject, 
	ObjectIDType inFormXObjectID, 
	png_uint_32 transformed_width, 
	png_uint_32 transformed_height, 
	DocumentContext* inDocumentContext) {
	PDFFormXObject* formXObject = NULL;
	do
	{

		formXObject = inDocumentContext->StartFormXObject(PDFRectangle(0, 0, transformed_width, transformed_height), inFormXObjectID);
		if(!formXObject) {
			TRACE_LOG("PNGImageHandler::CreateImageFormXObjectFromImageXObject. Unexpected Error, could not start form XObject for image");
			break;
		}
		XObjectContentContext* xobjectContentContext = formXObject->GetContentContext();

		// iterate the images in the list and place one on top of each other
		PDFImageXObjectList::const_iterator it = inImageXObject.begin();
		for (; it != inImageXObject.end(); ++it) {
			xobjectContentContext->q();
			xobjectContentContext->cm(transformed_width, 0, 0, transformed_height, 0, 0);
			xobjectContentContext->Do(formXObject->GetResourcesDictionary().AddImageXObjectMapping(*it));
			xobjectContentContext->Q();
		}

		EStatusCode status = inDocumentContext->EndFormXObjectNoRelease(formXObject);
		if (status != PDFHummus::eSuccess)
		{
			TRACE_LOG("PNGImageHandler::CreateImageFormXObjectFromImageXObject. Unexpected Error, could not create form XObject for image");
			delete formXObject;
			formXObject = NULL;
			break;
		}


	} while (false);
	return formXObject;
}